

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::Extractor::Extractor(Extractor *this,Extractor *rhs)

{
  void *pvVar1;
  ExtractorPrivate *in_RSI;
  undefined8 *in_RDI;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_00000068;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_00000070;
  Net *in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__Extractor_01fa9898;
  pvVar1 = operator_new(0x60);
  ExtractorPrivate::ExtractorPrivate(in_RSI,in_stack_ffffffffffffffe8);
  in_RDI[1] = pvVar1;
  *(void **)in_RDI[1] =
       ((in_RSI->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start)->data;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=(in_stack_00000070,in_stack_00000068)
  ;
  memcpy((void *)(in_RDI[1] + 0x20),
         &((in_RSI->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start)->allocator,0x40);
  return;
}

Assistant:

Extractor::Extractor(const Extractor& rhs)
    : d(new ExtractorPrivate(0))
{
    d->net = rhs.d->net;
    d->blob_mats = rhs.d->blob_mats;
    d->opt = rhs.d->opt;

#if NCNN_VULKAN
    d->local_blob_vkallocator = 0;
    d->local_staging_vkallocator = 0;

    d->blob_mats_gpu = rhs.d->blob_mats_gpu;
    d->blob_mats_gpu_image = rhs.d->blob_mats_gpu_image;
#endif // NCNN_VULKAN
}